

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bws.c
# Opt level: O0

void nn_bws_start_accepting(nn_bws *self)

{
  void *pvVar1;
  nn_usock *in_RDI;
  int in_stack_0000000c;
  nn_aws *in_stack_00000010;
  
  if (*(long *)&in_RDI[1].s != 0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","self->aws == NULL",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/bws.c"
            ,0x180);
    fflush(_stderr);
    nn_err_abort();
  }
  pvVar1 = nn_alloc_(0x30cd04);
  *(void **)&in_RDI[1].s = pvVar1;
  if (*(long *)&in_RDI[1].s == 0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/bws.c"
            ,0x184);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_aws_init(in_stack_00000010,in_stack_0000000c,(nn_ep *)self,&in_RDI->fsm);
  nn_aws_start((nn_aws *)self,in_RDI);
  return;
}

Assistant:

static void nn_bws_start_accepting (struct nn_bws *self)
{
    nn_assert (self->aws == NULL);

    /*  Allocate new aws state machine. */
    self->aws = nn_alloc (sizeof (struct nn_aws), "aws");
    alloc_assert (self->aws);
    nn_aws_init (self->aws, NN_BWS_SRC_AWS, self->ep, &self->fsm);

    /*  Start waiting for a new incoming connection. */
    nn_aws_start (self->aws, &self->usock);
}